

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *pFVar4;
  double *pdVar5;
  ulong uVar6;
  value_type vVar7;
  double dVar8;
  double dVar9;
  
  uVar2 = (((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  uVar3 = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar3 != uVar2) {
    if (uVar3 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar3;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar3) {
        uVar6 = (long)(int)uVar3 << 3;
      }
      pdVar5 = (double *)operator_new__(uVar6);
      (this->dx_).ptr_to_data = pdVar5;
    }
  }
  if (uVar3 != 0) {
    pdVar5 = (this->dx_).ptr_to_data;
    if (((((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0) ||
       ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0)) {
      if (0 < (int)uVar3) {
        uVar6 = 0;
        do {
          vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
                  ::dx(&fadexpr->fadexpr_,(int)uVar6);
          pdVar5[uVar6] = vVar7;
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
    }
    else if (0 < (int)uVar3) {
      uVar6 = 0;
      do {
        vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar6);
        pdVar5[uVar6] = vVar7;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).left_;
  dVar1 = (pFVar4->fadexpr_).left_.constant_;
  dVar8 = cos((((pFVar4->fadexpr_).right_)->fadexpr_).expr_.val_);
  dVar9 = cos((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar9 * dVar8 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}